

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O3

Stream * rw::ps2::readADC(Stream *stream,int32 param_2,void *object,int32 offset,int32 param_5)

{
  bool bVar1;
  int32 iVar2;
  uint uVar3;
  undefined8 uVar4;
  long lVar5;
  
  bVar1 = findChunk(stream,0x134,(uint32 *)0x0,(uint32 *)0x0);
  if (bVar1) {
    lVar5 = (long)offset;
    iVar2 = Stream::readI32(stream);
    *(int32 *)((long)object + lVar5 + 0x10) = iVar2;
    *(undefined4 *)((long)object + lVar5) = 1;
    if (iVar2 == 0) {
      *(undefined8 *)((long)object + lVar5 + 8) = 0;
      *(undefined4 *)((long)object + lVar5 + 0x10) = 0;
    }
    else {
      uVar3 = iVar2 + 3U & 0xfffffffc;
      allocLocation =
           "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/ps2/ps2.cpp line: 1286"
      ;
      uVar4 = (*DAT_0014ada8)((long)(int)uVar3,0x30134);
      *(undefined8 *)((long)object + lVar5 + 8) = uVar4;
      (*stream->_vptr_Stream[4])(stream,uVar4,(ulong)uVar3);
    }
  }
  else {
    readADC();
    stream = (Stream *)0x0;
  }
  return stream;
}

Assistant:

static Stream*
readADC(Stream *stream, int32, void *object, int32 offset, int32)
{
	ADCData *adc = PLUGINOFFSET(ADCData, object, offset);
	if(!findChunk(stream, ID_ADC, nil, nil)){
		RWERROR((ERR_CHUNK, "ADC"));
		return nil;
	}
	adc->numBits = stream->readI32();
	adc->adcFormatted = 1;
	if(adc->numBits == 0){
		adc->adcBits = nil;
		adc->numBits = 0;
		return stream;
	}
	int32 size = adc->numBits+3 & ~3;
	adc->adcBits = rwNewT(int8, size, MEMDUR_EVENT | ID_ADC);
	stream->read8(adc->adcBits, size);
	return stream;
}